

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionDefinition.h
# Opt level: O2

void __thiscall
Jinx::Impl::FunctionDefinition::FunctionDefinition
          (FunctionDefinition *this,FunctionSignature *signature,FunctionCallback *callback)

{
  size_t sVar1;
  
  this->m_id = signature->m_id;
  sVar1 = FunctionSignature::GetParameterCount(signature);
  this->m_parameterCount = sVar1;
  (this->m_bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_offset = 0;
  FunctionSignature::GetName_abi_cxx11_(&this->m_name,signature);
  std::
  function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
  ::function(&this->m_callback,callback);
  return;
}

Assistant:

FunctionDefinition(const FunctionSignature & signature, FunctionCallback callback) :
			m_id(signature.GetId()),
			m_parameterCount(signature.GetParameterCount()),
			m_bytecode(nullptr),
			m_offset(0),
			m_name(signature.GetName()),
			m_callback(callback)
		{}